

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tests.cpp
# Opt level: O1

bool __thiscall
serialize_tests::CSerializeMethodsTestSingle::operator==
          (CSerializeMethodsTestSingle *this,CSerializeMethodsTestSingle *rhs)

{
  long lVar1;
  size_t __n;
  element_type *peVar2;
  element_type *peVar3;
  int iVar4;
  long in_FS_OFFSET;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->intval == rhs->intval) && (this->boolval == rhs->boolval)) &&
     (__n = (this->stringval)._M_string_length, __n == (rhs->stringval)._M_string_length)) {
    if (__n != 0) {
      iVar4 = bcmp((this->stringval)._M_dataplus._M_p,(rhs->stringval)._M_dataplus._M_p,__n);
      if (iVar4 != 0) goto LAB_00628e34;
    }
    iVar4 = strcmp(this->charstrval,rhs->charstrval);
    if (iVar4 == 0) {
      peVar2 = (this->txval).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      peVar3 = (rhs->txval).super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      auVar7[0] = -((peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0] ==
                   (peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems[0]);
      auVar7[1] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                              + 1) ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             1));
      auVar7[2] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                              + 2) ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             2));
      auVar7[3] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                              + 3) ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             3));
      auVar7[4] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                              + 4) ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             4));
      auVar7[5] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                              + 5) ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             5));
      auVar7[6] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                              + 6) ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             6));
      auVar7[7] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                              + 7) ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             7));
      auVar7[8] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                              + 8) ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             8));
      auVar7[9] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                              + 9) ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             9));
      auVar7[10] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 10) ==
                    *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                              + 10));
      auVar7[0xb] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 0xb) ==
                     *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 0xb));
      auVar7[0xc] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 0xc) ==
                     *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 0xc));
      auVar7[0xd] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 0xd) ==
                     *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 0xd));
      auVar7[0xe] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 0xe) ==
                     *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 0xe));
      auVar7[0xf] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 0xf) ==
                     *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 0xf));
      auVar6[0] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                              + 0x10) ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0x10));
      auVar6[1] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                              + 0x11) ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0x11));
      auVar6[2] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                              + 0x12) ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0x12));
      auVar6[3] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                              + 0x13) ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0x13));
      auVar6[4] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                              + 0x14) ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0x14));
      auVar6[5] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                              + 0x15) ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0x15));
      auVar6[6] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                              + 0x16) ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0x16));
      auVar6[7] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                              + 0x17) ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0x17));
      auVar6[8] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                              + 0x18) ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0x18));
      auVar6[9] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                              + 0x19) ==
                   *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems +
                             0x19));
      auVar6[10] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 0x1a) ==
                    *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                              + 0x1a));
      auVar6[0xb] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 0x1b) ==
                     *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 0x1b));
      auVar6[0xc] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 0x1c) ==
                     *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 0x1c));
      auVar6[0xd] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 0x1d) ==
                     *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 0x1d));
      auVar6[0xe] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 0x1e) ==
                     *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 0x1e));
      auVar6[0xf] = -(*(uchar *)((long)(peVar3->hash).m_wrapped.super_base_blob<256U>.m_data.
                                       _M_elems + 0x1f) ==
                     *(uchar *)((long)(peVar2->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems
                               + 0x1f));
      auVar6 = auVar6 & auVar7;
      bVar5 = (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar6 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar6 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar6 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar6 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar6 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar6 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar6 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar6 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar6 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar6 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar6 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar6 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar6 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar6[0xf] >> 7) << 0xf) == 0xffff;
      goto LAB_00628e36;
    }
  }
LAB_00628e34:
  bVar5 = false;
LAB_00628e36:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool operator==(const CSerializeMethodsTestSingle& rhs) const
    {
        return intval == rhs.intval &&
               boolval == rhs.boolval &&
               stringval == rhs.stringval &&
               strcmp(charstrval, rhs.charstrval) == 0 &&
               *txval == *rhs.txval;
    }